

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O3

char * fread_line(FILE *stream,size_t *out_len)

{
  char *pcVar1;
  size_t sVar2;
  char *ptr;
  long lVar3;
  char *pcVar4;
  char buf [128];
  undefined8 local_c0;
  char local_b8 [136];
  
  pcVar4 = (char *)0x0;
  ptr = (char *)0x0;
  local_c0 = out_len;
  while( true ) {
    pcVar1 = fgets(local_b8,0x80,(FILE *)stream);
    if (pcVar1 == (char *)0x0) break;
    sVar2 = strlen(local_b8);
    if (ptr == (char *)0x0) {
      ptr = (char *)__ckd_malloc__(sVar2 + 1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                   ,0x184);
      pcVar4 = ptr;
    }
    else {
      lVar3 = (long)pcVar4 - (long)ptr;
      ptr = (char *)__ckd_realloc__(ptr,sVar2 + lVar3 + 1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                    ,0x189);
      pcVar4 = ptr + lVar3;
    }
    memcpy(pcVar4,local_b8,sVar2 + 1);
    pcVar4 = pcVar4 + sVar2;
    if ((sVar2 < 0x7f) || (local_b8[sVar2 - 1] == '\n')) break;
  }
  if (local_c0 != (size_t *)0x0) {
    *local_c0 = (long)pcVar4 - (long)ptr;
  }
  return ptr;
}

Assistant:

char *
fread_line(FILE *stream, size_t *out_len)
{
    char *output, *outptr;
    char buf[128];

    output = outptr = NULL;
    while (fgets(buf, sizeof(buf), stream)) {
        size_t len = strlen(buf);
        /* Append this data to the buffer. */
        if (output == NULL) {
            output = (char *)ckd_malloc(len + 1);
            outptr = output;
        }
        else {
            size_t cur = outptr - output;
            output = (char *)ckd_realloc(output, cur + len + 1);
            outptr = output + cur;
        }
        memcpy(outptr, buf, len + 1);
        outptr += len;
        /* Stop on a short read or end of line. */
        if (len < sizeof(buf)-1 || buf[len-1] == '\n')
            break;
    }
    if (out_len) *out_len = outptr - output;
    return output;
}